

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,uint8 *value,uint64 size)

{
  int32 iVar1;
  int iVar2;
  ulong in_RCX;
  uint64 in_RDX;
  IMkvWriter *in_RSI;
  undefined8 *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  if (((in_RDI == (undefined8 *)0x0) || (in_RDX == 0)) || (in_RCX == 0)) {
    bVar3 = false;
  }
  else {
    iVar1 = WriteID((IMkvWriter *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (uint64)in_RDI);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(in_RSI,in_RDX);
      if (iVar1 == 0) {
        iVar2 = (**(code **)*in_RDI)(in_RDI,in_RDX,in_RCX & 0xffffffff);
        if (iVar2 == 0) {
          bVar3 = true;
        }
        else {
          bVar3 = false;
        }
      }
      else {
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const uint8* value,
                      uint64 size) {
  if (!writer || !value || size < 1)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, size))
    return false;

  if (writer->Write(value, static_cast<uint32>(size)))
    return false;

  return true;
}